

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterSymbols.cpp
# Opt level: O2

void __thiscall slang::ast::TypeParameterSymbol::checkTypeRestriction(TypeParameterSymbol *this)

{
  ForwardTypeRestriction FVar1;
  Scope *this_00;
  bool bVar2;
  ForwardTypeRestriction FVar3;
  Type *this_01;
  Diagnostic *this_02;
  SyntaxNode *this_03;
  SourceRange sourceRange;
  string_view arg;
  
  if (this->typeRestriction != None) {
    this_01 = DeclaredType::getType(&this->targetType);
    bVar2 = Type::isError(this_01);
    if (!bVar2) {
      FVar1 = this->typeRestriction;
      FVar3 = SemanticFacts::getTypeRestriction(this_01);
      if (FVar1 != FVar3) {
        this_00 = (this->super_Symbol).parentScope;
        if (*(int *)&(this->targetType).field_0x3c < 0) {
          this_03 = (SyntaxNode *)0x0;
        }
        else {
          this_03 = (SyntaxNode *)(this->targetType).typeOrLink.typeSyntax;
        }
        sourceRange = slang::syntax::SyntaxNode::sourceRange(this_03);
        this_02 = Scope::addDiag(this_00,(DiagCode)0xc90006,sourceRange);
        arg = SemanticFacts::getTypeRestrictionText(this->typeRestriction);
        Diagnostic::operator<<(this_02,arg);
        ast::operator<<(this_02,this_01);
        bVar2 = isOverridden(this);
        if (bVar2) {
          Diagnostic::addNote(this_02,(DiagCode)0x50001,(this->super_Symbol).location);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void TypeParameterSymbol::checkTypeRestriction() const {
    if (typeRestriction != ForwardTypeRestriction::None) {
        auto& type = targetType.getType();
        if (!type.isError() && typeRestriction != SemanticFacts::getTypeRestriction(type)) {
            auto scope = getParentScope();
            auto typeSyntax = targetType.getTypeSyntax();
            SLANG_ASSERT(scope && typeSyntax);

            auto& diag = scope->addDiag(diag::TypeRestrictionMismatch, typeSyntax->sourceRange());
            diag << SemanticFacts::getTypeRestrictionText(typeRestriction);
            diag << type;

            if (isOverridden())
                diag.addNote(diag::NoteDeclarationHere, location);
        }
    }
}